

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall
ObjectTest_basic_has_set_Test::~ObjectTest_basic_has_set_Test(ObjectTest_basic_has_set_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, basic_has_set) {
	object obj;

	EXPECT_FALSE(obj.has<std::set<bool>>());
	EXPECT_FALSE(obj.has<std::set<signed char>>());
	EXPECT_FALSE(obj.has<std::set<unsigned char>>());
	EXPECT_FALSE(obj.has<std::set<short>>());
	EXPECT_FALSE(obj.has<std::set<int>>());
	EXPECT_FALSE(obj.has<std::set<long>>());
	EXPECT_FALSE(obj.has<std::set<long long>>());
	EXPECT_FALSE(obj.has<std::set<intmax_t>>());
	EXPECT_FALSE(obj.has<std::set<float>>());
	EXPECT_FALSE(obj.has<std::set<double>>());
	EXPECT_FALSE(obj.has<std::set<long double>>());
	EXPECT_FALSE(obj.has<std::set<std::u8string>>());
	EXPECT_FALSE(obj.has<std::set<object>>());
}